

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbuspendingcall.cpp
# Opt level: O0

void __thiscall
QDBusPendingCallWatcher::QDBusPendingCallWatcher
          (QDBusPendingCallWatcher *this,QDBusPendingCall *call,QObject *parent)

{
  long lVar1;
  bool bVar2;
  MessageType MVar3;
  QDBusPendingCallPrivate *pQVar4;
  QDBusPendingCallWatcherHelper *pQVar5;
  QObject *in_RDX;
  QDBusPendingCallWatcher *in_RSI;
  QObject *in_RDI;
  long in_FS_OFFSET;
  scoped_lock<QMutex> locker;
  QDBusPendingCall *in_stack_ffffffffffffffb8;
  ConnectionType type;
  QObject *object;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  object = in_RDI;
  QObject::QObject(in_RDI,in_RDX);
  type = (ConnectionType)((ulong)in_RDX >> 0x20);
  QDBusPendingCall::QDBusPendingCall((QDBusPendingCall *)in_RDI,in_stack_ffffffffffffffb8);
  *(undefined ***)in_RDI = &PTR_metaObject_002b6e10;
  bVar2 = QExplicitlySharedDataPointer::operator_cast_to_bool
                    ((QExplicitlySharedDataPointer<QDBusPendingCallPrivate> *)0x22ced8);
  if (bVar2) {
    QExplicitlySharedDataPointer<QDBusPendingCallPrivate>::operator->
              ((QExplicitlySharedDataPointer<QDBusPendingCallPrivate> *)0x22cefb);
    (anonymous_namespace)::qt_scoped_lock<QMutex,std::scoped_lock<QMutex>>
              ((QMutex *)in_stack_ffffffffffffffb8);
    pQVar4 = QExplicitlySharedDataPointer<QDBusPendingCallPrivate>::operator->
                       ((QExplicitlySharedDataPointer<QDBusPendingCallPrivate> *)0x22cf1a);
    if (pQVar4->watcherHelper == (QDBusPendingCallWatcherHelper *)0x0) {
      pQVar5 = (QDBusPendingCallWatcherHelper *)operator_new(0x10);
      QDBusPendingCallWatcherHelper::QDBusPendingCallWatcherHelper
                ((QDBusPendingCallWatcherHelper *)in_RDI);
      pQVar4 = QExplicitlySharedDataPointer<QDBusPendingCallPrivate>::operator->
                         ((QExplicitlySharedDataPointer<QDBusPendingCallPrivate> *)0x22cf49);
      pQVar4->watcherHelper = pQVar5;
      pQVar4 = QExplicitlySharedDataPointer<QDBusPendingCallPrivate>::operator->
                         ((QExplicitlySharedDataPointer<QDBusPendingCallPrivate> *)0x22cf5f);
      MVar3 = QDBusMessage::type(&pQVar4->replyMessage);
      if (MVar3 != InvalidMessage) {
        QExplicitlySharedDataPointer<QDBusPendingCallPrivate>::operator->
                  ((QExplicitlySharedDataPointer<QDBusPendingCallPrivate> *)0x22cf7e);
        QMetaObject::invokeMethod<void(QDBusPendingCallWatcherHelper::*)()>
                  ((ContextType *)object,(offset_in_QDBusPendingCallWatcherHelper_to_subr *)in_RSI,
                   type);
      }
    }
    QExplicitlySharedDataPointer<QDBusPendingCallPrivate>::operator->
              ((QExplicitlySharedDataPointer<QDBusPendingCallPrivate> *)0x22cfb6);
    QDBusPendingCallWatcherHelper::add((QDBusPendingCallWatcherHelper *)object,in_RSI);
    std::scoped_lock<QMutex>::~scoped_lock((scoped_lock<QMutex> *)0x22cfce);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QDBusPendingCallWatcher::QDBusPendingCallWatcher(const QDBusPendingCall &call, QObject *parent)
    : QObject(parent), QDBusPendingCall(call)
{
    if (d) {                    // QDBusPendingCall::d
        const auto locker = qt_scoped_lock(d->mutex);
        if (!d->watcherHelper) {
            d->watcherHelper = new QDBusPendingCallWatcherHelper;
            if (d->replyMessage.type() != QDBusMessage::InvalidMessage) {
                // cause a signal emission anyways
                QMetaObject::invokeMethod(d->watcherHelper,
                                          &QDBusPendingCallWatcherHelper::finished,
                                          Qt::QueuedConnection);
            }
        }
        d->watcherHelper->add(this);
    }
}